

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O0

int google::RUN_ALL_TESTS(void)

{
  bool bVar1;
  iterator __lhs;
  reference pp_Var2;
  size_type sVar3;
  const_iterator it;
  vector<void_(*)(),_std::allocator<void_(*)()>_> *in_stack_ffffffffffffffd8;
  FILE *__stream;
  __normal_iterator<void_(*const_*)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>
  *in_stack_ffffffffffffffe0;
  __normal_iterator<void_(*const_*)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>
  local_8;
  
  __gnu_cxx::
  __normal_iterator<void_(*const_*)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>::
  __normal_iterator(&local_8);
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::begin(in_stack_ffffffffffffffd8);
  __gnu_cxx::__normal_iterator<void(*const*)(),std::vector<void(*)(),std::allocator<void(*)()>>>::
  __normal_iterator<void(**)()>
            (in_stack_ffffffffffffffe0,
             (__normal_iterator<void_(**)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>
              *)in_stack_ffffffffffffffd8);
  while( true ) {
    __lhs = std::vector<void_(*)(),_std::allocator<void_(*)()>_>::end(in_stack_ffffffffffffffd8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<void_(*const_*)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<void_(**)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>
                        *)in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    pp_Var2 = __gnu_cxx::
              __normal_iterator<void_(*const_*)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>
              ::operator*(&local_8);
    (**pp_Var2)();
    __gnu_cxx::
    __normal_iterator<void_(*const_*)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>::
    operator++(&local_8);
  }
  __stream = _stderr;
  sVar3 = std::vector<void_(*)(),_std::allocator<void_(*)()>_>::size
                    ((vector<void_(*)(),_std::allocator<void_(*)()>_> *)g_testlist);
  fprintf(__stream,"Passed %d tests\n\nPASS\n",sVar3 & 0xffffffff);
  return 0;
}

Assistant:

static inline int RUN_ALL_TESTS() {
  vector<void (*)()>::const_iterator it;
  for (it = g_testlist.begin(); it != g_testlist.end(); ++it) {
    (*it)();
  }
  fprintf(stderr, "Passed %d tests\n\nPASS\n", (int)g_testlist.size());
  return 0;
}